

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O2

double calc_kurtosis_internal<long_double>
                 (size_t cnt,int *x,int ncat,size_t *buffer_cnt,double *buffer_prob,
                 MissingAction missing_action,CategSplit cat_split_type,Xoshiro256PP *rnd_generator)

{
  double dVar1;
  float fVar2;
  int cat;
  size_t iternum;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  int cat_1;
  longdouble in_ST0;
  longdouble lVar7;
  longdouble lVar8;
  longdouble lVar9;
  longdouble lVar10;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble lVar11;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  double dVar15;
  UniformUnitInterval runif;
  double local_c0;
  longdouble local_b4;
  longdouble local_a8;
  longdouble local_9c;
  size_t ntry;
  
  uVar4 = cnt - buffer_cnt[ncat];
  dVar13 = -INFINITY;
  if (1 < uVar4) {
    fVar2 = (float)(&DAT_003250d8)[(long)uVar4 < 0];
    uVar5 = 0;
    uVar6 = 0;
    if (0 < ncat) {
      uVar6 = (ulong)(uint)ncat;
    }
    for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
      buffer_prob[uVar5] =
           (double)(((float)(long)buffer_cnt[uVar5] +
                    (float)(&DAT_003250d8)[(long)buffer_cnt[uVar5] < 0]) /
                   ((float)(long)uVar4 + fVar2));
    }
    if (cat_split_type == SubSet) {
      ntry = 0x32;
      local_c0 = 0.0;
      for (lVar3 = 0; lVar3 != 0x32; lVar3 = lVar3 + 1) {
        lVar8 = (longdouble)0;
        lVar9 = in_ST0;
        lVar10 = in_ST1;
        local_b4 = lVar8;
        local_a8 = lVar8;
        local_9c = lVar8;
        for (uVar4 = 0; lVar7 = in_ST2, in_ST1 = lVar10, in_ST0 = lVar9, uVar6 != uVar4;
            uVar4 = uVar4 + 1) {
          Xoshiro::UniformUnitInterval::operator()(&runif,rnd_generator);
          lVar8 = in_ST3;
          lVar10 = in_ST4;
          in_ST2 = in_ST4;
          in_ST3 = in_ST4;
          fmal();
          fmal();
          lVar11 = in_ST3;
          fmal();
          fmal();
          lVar9 = in_ST4;
          in_ST4 = lVar11;
          local_b4 = lVar7;
          local_a8 = in_ST1;
          local_9c = in_ST0;
        }
        lVar9 = local_9c * local_9c;
        lVar10 = local_a8 - lVar9;
        if (lVar10 <= (longdouble)0) {
          ntry = ntry - 1;
        }
        else {
          local_c0 = (double)((lVar9 * local_9c * local_9c +
                              (longdouble)-4.0 * local_9c * lVar9 * local_9c +
                              local_a8 * (longdouble)6.0 * lVar9 +
                              local_b4 * (longdouble)-4.0 * local_9c + lVar8) / (lVar10 * lVar10) +
                             (longdouble)local_c0);
          in_ST1 = in_ST0;
        }
        in_ST2 = in_ST1;
        in_ST3 = in_ST1;
        in_ST4 = in_ST1;
      }
      dVar13 = -INFINITY;
      if ((ntry != 0) && ((ulong)ABS(local_c0) < 0x7ff0000000000000)) {
        auVar14._8_4_ = (int)(ntry >> 0x20);
        auVar14._0_8_ = ntry;
        auVar14._12_4_ = 0x45300000;
        if (local_c0 <= 0.0) {
          local_c0 = 0.0;
        }
        dVar13 = local_c0 /
                 ((auVar14._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)ntry) - 4503599627370496.0));
      }
    }
    else {
      dVar12 = 0.0;
      for (uVar4 = 0; uVar6 != uVar4; uVar4 = uVar4 + 1) {
        dVar1 = buffer_prob[uVar4];
        if ((dVar1 != 0.0) || (NAN(dVar1))) {
          dVar15 = dVar1 * dVar1;
          dVar12 = dVar12 + (dVar1 * dVar15 * dVar1 +
                            dVar1 * -4.0 * dVar1 * dVar15 +
                            dVar1 * 6.0 * dVar15 + dVar1 * -4.0 * dVar1 + dVar1) /
                            ((dVar1 - dVar15) * (dVar1 - dVar15));
        }
        else {
          ncat = ncat + -1;
        }
      }
      if ((1 < ncat) && ((ulong)ABS(dVar12) < 0x7ff0000000000000)) {
        if (dVar12 <= 0.0) {
          dVar12 = 0.0;
        }
        dVar13 = dVar12 / (double)ncat;
      }
    }
  }
  return dVar13;
}

Assistant:

double calc_kurtosis_internal(size_t cnt, int x[], int ncat, size_t buffer_cnt[], double buffer_prob[],
                              MissingAction missing_action, CategSplit cat_split_type, RNG_engine &rnd_generator)
{
    /* This calculation proceeds as follows:
        - If splitting by subsets, it will assign a random weight ~Unif(0,1) to
          each category, and approximate kurtosis by sampling from such distribution
          with the same probabilities as given by the current counts.
        - If splitting by isolating one category, will binarize at each categorical level,
          assume the values are zero or one, and output the average assuming each categorical
          level has equal probability of being picked.
        (Note that both are misleading heuristics, but might be better than random)
    */
    double sum_kurt = 0;

    cnt -= buffer_cnt[ncat];
    if (cnt <= 1) return -HUGE_VAL;
    ldouble_safe cnt_l = (ldouble_safe) cnt;
    for (int cat = 0; cat < ncat; cat++)
        buffer_prob[cat] = buffer_cnt[cat] / cnt_l;

    switch (cat_split_type)
    {
        case SubSet:
        {
            ldouble_safe temp_v;
            ldouble_safe s1, s2, s3, s4;
            ldouble_safe coef;
            ldouble_safe coef2;
            ldouble_safe w_this;
            UniformUnitInterval runif(0, 1);
            size_t ntry = 50;
            for (size_t iternum = 0; iternum < 50; iternum++)
            {
                s1 = 0; s2 = 0; s3 = 0; s4 = 0;
                for (int cat = 0; cat < ncat; cat++)
                {
                    coef = runif(rnd_generator);
                    coef2 = coef * coef;
                    w_this = buffer_prob[cat];
                    s1 = std::fma(w_this, coef, s1);
                    s2 = std::fma(w_this, coef2, s2);
                    s3 = std::fma(w_this, coef2*coef, s3);
                    s4 = std::fma(w_this, coef2*coef2, s4);
                    // s1 += buffer_prob[cat] * pw1(coef);
                    // s2 += buffer_prob[cat] * pw2(coef);
                    // s3 += buffer_prob[cat] * pw3(coef);
                    // s4 += buffer_prob[cat] * pw4(coef);
                }
                temp_v = s2 - pw2(s1);
                if (temp_v <= 0)
                    ntry--;
                else
                    sum_kurt += (s4 - 4 * s3 * pw1(s1) + 6 * s2 * pw2(s1) - 4 * s1 * pw3(s1) + pw4(s1)) / pw2(temp_v);
            }
            if (unlikely(!ntry))
                return -HUGE_VAL;
            else if (unlikely(is_na_or_inf(sum_kurt)))
                return -HUGE_VAL;
            else
                return std::fmax(sum_kurt, 0.) / (double)ntry;
        }

        case SingleCateg:
        {
            double p;
            int ncat_present = ncat;
            for (int cat = 0; cat < ncat; cat++)
            {
                p = buffer_prob[cat];
                if (p == 0)
                    ncat_present--;
                else
                    sum_kurt += (p - 4 * p * pw1(p) + 6 * p * pw2(p) - 4 * p * pw3(p) + pw4(p)) / pw2(p - pw2(p));
            }
            if (ncat_present <= 1)
                return -HUGE_VAL;
            else if (unlikely(is_na_or_inf(sum_kurt)))
                return -HUGE_VAL;
            else
                return std::fmax(sum_kurt, 0.) / (double)ncat_present;
        }
    }

    unreachable();
    return -1; /* this will never be reached, but CRAN complains otherwise */
}